

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::PubkeyListData,cfd::js::api::json::PubkeyData,cfd::js::api::PubkeyListDataStruct,cfd::js::api::PubkeyDataStruct>
          (json *this,string *request_message,
          function<cfd::js::api::PubkeyDataStruct_(const_cfd::js::api::PubkeyListDataStruct_&)>
          *call_function)

{
  ErrorResponse local_4c8;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_410 [4];
  JsonClassBase<cfd::js::api::json::PubkeyData> local_3f0 [4];
  undefined1 local_3d0 [8];
  PubkeyData res_2;
  undefined1 local_370 [8];
  PubkeyDataStruct response;
  PubkeyListDataStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_78 [8];
  PubkeyListData req;
  function<cfd::js::api::PubkeyDataStruct_(const_cfd::js::api::PubkeyListDataStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req.pubkeys_.
  super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)call_function;
  PubkeyListData::PubkeyListData((PubkeyListData *)local_78);
  core::JsonClassBase<cfd::js::api::json::PubkeyListData>::Deserialize
            ((JsonClassBase<cfd::js::api::json::PubkeyListData> *)local_78,request_message);
  PubkeyListData::ConvertToStruct
            ((PubkeyListDataStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (PubkeyListData *)local_78);
  std::function<cfd::js::api::PubkeyDataStruct_(const_cfd::js::api::PubkeyListDataStruct_&)>::
  operator()((PubkeyDataStruct *)local_370,call_function,
             (PubkeyListDataStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2._87_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._24_4_ == 0) {
    PubkeyData::PubkeyData((PubkeyData *)local_3d0);
    PubkeyData::ConvertFromStruct((PubkeyData *)local_3d0,(PubkeyDataStruct *)local_370);
    core::JsonClassBase<cfd::js::api::json::PubkeyData>::Serialize_abi_cxx11_(local_3f0);
    std::__cxx11::string::operator=((string *)this,(string *)local_3f0);
    std::__cxx11::string::~string((string *)local_3f0);
    PubkeyData::~PubkeyData((PubkeyData *)local_3d0);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_4c8,(InnerErrorResponseStruct *)&response.field_0x18);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_410);
    std::__cxx11::string::operator=((string *)this,(string *)local_410);
    std::__cxx11::string::~string((string *)local_410);
    ErrorResponse::~ErrorResponse(&local_4c8);
  }
  res_2._87_1_ = 1;
  PubkeyDataStruct::~PubkeyDataStruct((PubkeyDataStruct *)local_370);
  PubkeyListDataStruct::~PubkeyListDataStruct
            ((PubkeyListDataStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  PubkeyListData::~PubkeyListData((PubkeyListData *)local_78);
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}